

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# case.c
# Opt level: O3

int32 strncmp_nocase(char *str1,char *str2,size_t len)

{
  char cVar1;
  long lVar2;
  char cVar3;
  char cVar4;
  bool bVar5;
  
  if (str2 == (char *)0x0 || str1 == (char *)0x0) {
    return -(uint)(str1 == (char *)0x0) | 1;
  }
  if (len != 0) {
    lVar2 = 0;
    while( true ) {
      cVar1 = str1[lVar2];
      cVar3 = cVar1 + -0x20;
      if (0x19 < (byte)(cVar1 + 0x9fU)) {
        cVar3 = cVar1;
      }
      cVar1 = str2[lVar2];
      cVar4 = cVar1 + -0x20;
      if (0x19 < (byte)(cVar1 + 0x9fU)) {
        cVar4 = cVar1;
      }
      if (cVar3 != cVar4) break;
      if ((cVar3 == '\0') || (bVar5 = len - 1 == lVar2, lVar2 = lVar2 + 1, bVar5)) {
        return 0;
      }
    }
    return (int)cVar3 - (int)cVar4;
  }
  return 0;
}

Assistant:

int32
strncmp_nocase(const char *str1, const char *str2, size_t len)
{
    char c1, c2;

    if (str1 && str2) {
        size_t n;

        for (n = 0; n < len; ++n) {
            c1 = *(str1++);
            c1 = UPPER_CASE(c1);
            c2 = *(str2++);
            c2 = UPPER_CASE(c2);
            if (c1 != c2)
                return (c1 - c2);
            if (c1 == '\0')
                return 0;
        }
    }
    else
        return (str1 == NULL) ? -1 : 1;

    return 0;
}